

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeId.hpp
# Opt level: O1

long ableton::link::NodeId::random(void)

{
  uint uVar1;
  result_type rVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  NodeId nodeId;
  uniform_int_distribution<unsigned_int> dist;
  mt19937 gen;
  random_device rd;
  long local_2738;
  param_type local_2730;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2728;
  random_device local_13a0;
  
  std::random_device::random_device(&local_13a0);
  uVar1 = std::random_device::_M_getval();
  local_2728._M_x[0] = (unsigned_long)uVar1;
  lVar4 = 1;
  uVar3 = local_2728._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_2728._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_2728._M_p = 0x270;
  local_2730._M_a = 0x21;
  local_2730._M_b = 0x7e;
  lVar4 = 0;
  do {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_2730,&local_2728,&local_2730
                      );
    *(char *)((long)&local_2738 + lVar4) = (char)rVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  std::random_device::_M_fini();
  return local_2738;
}

Assistant:

static NodeId random()
  {
    using namespace std;

    random_device rd;
    mt19937 gen(rd());
    // uint8_t not standardized for this type - use unsigned
    uniform_int_distribution<unsigned> dist(33, 126); // printable ascii chars

    NodeId nodeId;
    generate(
      nodeId.begin(), nodeId.end(), [&] { return static_cast<uint8_t>(dist(gen)); });
    return nodeId;
  }